

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O0

FxExpression * ParseClamp(FScanner *sc,PClassActor *cls)

{
  undefined8 uVar1;
  FxExpression *pFVar2;
  FxExpression *pFVar3;
  FxExpression **ppFVar4;
  FxMinMax *pFVar5;
  FScriptPosition local_88;
  FName local_78;
  undefined1 local_71;
  FScriptPosition local_70;
  FName local_5c;
  FxMinMax *local_58;
  FxExpression *maxexpr;
  undefined1 local_40 [8];
  TArray<FxExpression_*,_FxExpression_*> list;
  FxExpression *max;
  FxExpression *min;
  FxExpression *src;
  PClassActor *cls_local;
  FScanner *sc_local;
  
  pFVar2 = ParseExpressionM(sc,cls);
  FScanner::MustGetToken(sc,0x2c);
  pFVar3 = ParseExpressionM(sc,cls);
  FScanner::MustGetToken(sc,0x2c);
  list._8_8_ = ParseExpressionM(sc,cls);
  FScanner::MustGetToken(sc,0x29);
  TArray<FxExpression_*,_FxExpression_*>::TArray
            ((TArray<FxExpression_*,_FxExpression_*> *)local_40,2);
  TArray<FxExpression_*,_FxExpression_*>::Reserve
            ((TArray<FxExpression_*,_FxExpression_*> *)local_40,2);
  ppFVar4 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                      ((TArray<FxExpression_*,_FxExpression_*> *)local_40,0);
  *ppFVar4 = pFVar2;
  ppFVar4 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                      ((TArray<FxExpression_*,_FxExpression_*> *)local_40,1);
  *ppFVar4 = pFVar3;
  pFVar5 = (FxMinMax *)operator_new(0x50);
  local_71 = 1;
  FName::FName(&local_5c,NAME_Max);
  FScriptPosition::FScriptPosition(&local_70,sc);
  FxMinMax::FxMinMax(pFVar5,(TArray<FxExpression_*,_FxExpression_*> *)local_40,&local_5c,&local_70);
  local_71 = 0;
  FScriptPosition::~FScriptPosition(&local_70);
  local_58 = pFVar5;
  ppFVar4 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                      ((TArray<FxExpression_*,_FxExpression_*> *)local_40,0);
  uVar1 = list._8_8_;
  *ppFVar4 = (FxExpression *)pFVar5;
  ppFVar4 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                      ((TArray<FxExpression_*,_FxExpression_*> *)local_40,1);
  *ppFVar4 = (FxExpression *)uVar1;
  pFVar5 = (FxMinMax *)operator_new(0x50);
  FName::FName(&local_78,NAME_Min);
  FScriptPosition::FScriptPosition(&local_88,sc);
  FxMinMax::FxMinMax(pFVar5,(TArray<FxExpression_*,_FxExpression_*> *)local_40,&local_78,&local_88);
  FScriptPosition::~FScriptPosition(&local_88);
  TArray<FxExpression_*,_FxExpression_*>::~TArray
            ((TArray<FxExpression_*,_FxExpression_*> *)local_40);
  return &pFVar5->super_FxExpression;
}

Assistant:

static FxExpression *ParseClamp(FScanner &sc, PClassActor *cls)
{
	FxExpression *src = ParseExpressionM(sc, cls);
	sc.MustGetToken(',');
	FxExpression *min = ParseExpressionM(sc, cls);
	sc.MustGetToken(',');
	FxExpression *max = ParseExpressionM(sc, cls);
	sc.MustGetToken(')');

	// Build clamp(a,x,y) as min(max(a,x),y)
	TArray<FxExpression *> list(2);
	list.Reserve(2);
	list[0] = src;
	list[1] = min;
	FxExpression *maxexpr = new FxMinMax(list, NAME_Max, sc);
	list[0] = maxexpr;
	list[1] = max;
	return new FxMinMax(list, NAME_Min, sc);
}